

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O0

void crypto::sha1_transform::transform(hash_word *state,hash_word *data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint *in_RSI;
  uint *in_RDI;
  hash_word e;
  hash_word d;
  hash_word c;
  hash_word b;
  hash_word a;
  hash_word W [16];
  
  uVar22 = *in_RDI;
  uVar21 = in_RDI[1];
  uVar6 = in_RDI[2];
  uVar4 = in_RDI[3];
  uVar2 = in_RDI[4];
  uVar20 = *in_RSI;
  uVar1 = util::rotl_fixed<unsigned_int>(uVar22,5);
  uVar2 = (uVar4 ^ uVar21 & (uVar6 ^ uVar4)) + uVar20 + 0x5a827999 + uVar1 + uVar2;
  uVar3 = util::rotl_fixed<unsigned_int>(uVar21,0x1e);
  uVar21 = in_RSI[1];
  uVar1 = util::rotl_fixed<unsigned_int>(uVar2,5);
  uVar4 = (uVar6 ^ uVar22 & (uVar3 ^ uVar6)) + uVar21 + 0x5a827999 + uVar1 + uVar4;
  uVar5 = util::rotl_fixed<unsigned_int>(uVar22,0x1e);
  uVar22 = in_RSI[2];
  uVar1 = util::rotl_fixed<unsigned_int>(uVar4,5);
  uVar6 = (uVar3 ^ uVar2 & (uVar5 ^ uVar3)) + uVar22 + 0x5a827999 + uVar1 + uVar6;
  uVar7 = util::rotl_fixed<unsigned_int>(uVar2,0x1e);
  uVar2 = in_RSI[3];
  uVar1 = util::rotl_fixed<unsigned_int>(uVar6,5);
  uVar3 = (uVar5 ^ uVar4 & (uVar7 ^ uVar5)) + uVar2 + 0x5a827999 + uVar1 + uVar3;
  uVar8 = util::rotl_fixed<unsigned_int>(uVar4,0x1e);
  uVar4 = in_RSI[4];
  uVar1 = util::rotl_fixed<unsigned_int>(uVar3,5);
  uVar5 = (uVar7 ^ uVar6 & (uVar8 ^ uVar7)) + uVar4 + 0x5a827999 + uVar1 + uVar5;
  uVar9 = util::rotl_fixed<unsigned_int>(uVar6,0x1e);
  uVar6 = in_RSI[5];
  uVar1 = util::rotl_fixed<unsigned_int>(uVar5,5);
  uVar7 = (uVar8 ^ uVar3 & (uVar9 ^ uVar8)) + uVar6 + 0x5a827999 + uVar1 + uVar7;
  uVar10 = util::rotl_fixed<unsigned_int>(uVar3,0x1e);
  uVar1 = in_RSI[6];
  uVar3 = util::rotl_fixed<unsigned_int>(uVar7,5);
  uVar8 = (uVar9 ^ uVar5 & (uVar10 ^ uVar9)) + uVar1 + 0x5a827999 + uVar3 + uVar8;
  uVar11 = util::rotl_fixed<unsigned_int>(uVar5,0x1e);
  uVar3 = in_RSI[7];
  uVar5 = util::rotl_fixed<unsigned_int>(uVar8,5);
  uVar9 = (uVar10 ^ uVar7 & (uVar11 ^ uVar10)) + uVar3 + 0x5a827999 + uVar5 + uVar9;
  uVar12 = util::rotl_fixed<unsigned_int>(uVar7,0x1e);
  uVar5 = in_RSI[8];
  uVar7 = util::rotl_fixed<unsigned_int>(uVar9,5);
  uVar10 = (uVar11 ^ uVar8 & (uVar12 ^ uVar11)) + uVar5 + 0x5a827999 + uVar7 + uVar10;
  uVar13 = util::rotl_fixed<unsigned_int>(uVar8,0x1e);
  uVar7 = in_RSI[9];
  uVar8 = util::rotl_fixed<unsigned_int>(uVar10,5);
  uVar11 = (uVar12 ^ uVar9 & (uVar13 ^ uVar12)) + uVar7 + 0x5a827999 + uVar8 + uVar11;
  uVar14 = util::rotl_fixed<unsigned_int>(uVar9,0x1e);
  uVar8 = in_RSI[10];
  uVar9 = util::rotl_fixed<unsigned_int>(uVar11,5);
  uVar12 = (uVar13 ^ uVar10 & (uVar14 ^ uVar13)) + uVar8 + 0x5a827999 + uVar9 + uVar12;
  uVar15 = util::rotl_fixed<unsigned_int>(uVar10,0x1e);
  uVar9 = in_RSI[0xb];
  uVar10 = util::rotl_fixed<unsigned_int>(uVar12,5);
  uVar13 = (uVar14 ^ uVar11 & (uVar15 ^ uVar14)) + uVar9 + 0x5a827999 + uVar10 + uVar13;
  uVar16 = util::rotl_fixed<unsigned_int>(uVar11,0x1e);
  uVar10 = in_RSI[0xc];
  uVar11 = util::rotl_fixed<unsigned_int>(uVar13,5);
  uVar14 = (uVar15 ^ uVar12 & (uVar16 ^ uVar15)) + uVar10 + 0x5a827999 + uVar11 + uVar14;
  uVar17 = util::rotl_fixed<unsigned_int>(uVar12,0x1e);
  uVar11 = in_RSI[0xd];
  uVar12 = util::rotl_fixed<unsigned_int>(uVar14,5);
  uVar15 = (uVar16 ^ uVar13 & (uVar17 ^ uVar16)) + uVar11 + 0x5a827999 + uVar12 + uVar15;
  uVar18 = util::rotl_fixed<unsigned_int>(uVar13,0x1e);
  uVar12 = in_RSI[0xe];
  uVar13 = util::rotl_fixed<unsigned_int>(uVar15,5);
  uVar16 = (uVar17 ^ uVar14 & (uVar18 ^ uVar17)) + uVar12 + 0x5a827999 + uVar13 + uVar16;
  uVar19 = util::rotl_fixed<unsigned_int>(uVar14,0x1e);
  uVar13 = in_RSI[0xf];
  uVar14 = util::rotl_fixed<unsigned_int>(uVar16,5);
  uVar17 = (uVar18 ^ uVar15 & (uVar19 ^ uVar18)) + uVar13 + 0x5a827999 + uVar14 + uVar17;
  uVar15 = util::rotl_fixed<unsigned_int>(uVar15,0x1e);
  uVar20 = util::rotl_fixed<unsigned_int>(uVar11 ^ uVar5 ^ uVar22 ^ uVar20,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar17,5);
  uVar18 = (uVar19 ^ uVar16 & (uVar15 ^ uVar19)) + uVar20 + 0x5a827999 + uVar14 + uVar18;
  uVar16 = util::rotl_fixed<unsigned_int>(uVar16,0x1e);
  uVar21 = util::rotl_fixed<unsigned_int>(uVar12 ^ uVar7 ^ uVar2 ^ uVar21,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar18,5);
  uVar19 = (uVar15 ^ uVar17 & (uVar16 ^ uVar15)) + uVar21 + 0x5a827999 + uVar14 + uVar19;
  uVar17 = util::rotl_fixed<unsigned_int>(uVar17,0x1e);
  uVar22 = util::rotl_fixed<unsigned_int>(uVar13 ^ uVar8 ^ uVar4 ^ uVar22,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar19,5);
  uVar15 = (uVar16 ^ uVar18 & (uVar17 ^ uVar16)) + uVar22 + 0x5a827999 + uVar14 + uVar15;
  uVar18 = util::rotl_fixed<unsigned_int>(uVar18,0x1e);
  uVar2 = util::rotl_fixed<unsigned_int>(uVar20 ^ uVar9 ^ uVar6 ^ uVar2,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar15,5);
  uVar16 = (uVar17 ^ uVar19 & (uVar18 ^ uVar17)) + uVar2 + 0x5a827999 + uVar14 + uVar16;
  uVar19 = util::rotl_fixed<unsigned_int>(uVar19,0x1e);
  uVar4 = util::rotl_fixed<unsigned_int>(uVar21 ^ uVar10 ^ uVar1 ^ uVar4,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar16,5);
  uVar17 = (uVar15 ^ uVar19 ^ uVar18) + uVar4 + 0x6ed9eba1 + uVar14 + uVar17;
  uVar15 = util::rotl_fixed<unsigned_int>(uVar15,0x1e);
  uVar6 = util::rotl_fixed<unsigned_int>(uVar22 ^ uVar11 ^ uVar3 ^ uVar6,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar17,5);
  uVar18 = (uVar16 ^ uVar15 ^ uVar19) + uVar6 + 0x6ed9eba1 + uVar14 + uVar18;
  uVar16 = util::rotl_fixed<unsigned_int>(uVar16,0x1e);
  uVar1 = util::rotl_fixed<unsigned_int>(uVar2 ^ uVar12 ^ uVar5 ^ uVar1,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar18,5);
  uVar19 = (uVar17 ^ uVar16 ^ uVar15) + uVar1 + 0x6ed9eba1 + uVar14 + uVar19;
  uVar17 = util::rotl_fixed<unsigned_int>(uVar17,0x1e);
  uVar3 = util::rotl_fixed<unsigned_int>(uVar4 ^ uVar13 ^ uVar7 ^ uVar3,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar19,5);
  uVar15 = (uVar18 ^ uVar17 ^ uVar16) + uVar3 + 0x6ed9eba1 + uVar14 + uVar15;
  uVar18 = util::rotl_fixed<unsigned_int>(uVar18,0x1e);
  uVar5 = util::rotl_fixed<unsigned_int>(uVar6 ^ uVar20 ^ uVar8 ^ uVar5,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar15,5);
  uVar16 = (uVar19 ^ uVar18 ^ uVar17) + uVar5 + 0x6ed9eba1 + uVar14 + uVar16;
  uVar19 = util::rotl_fixed<unsigned_int>(uVar19,0x1e);
  uVar7 = util::rotl_fixed<unsigned_int>(uVar1 ^ uVar21 ^ uVar9 ^ uVar7,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar16,5);
  uVar17 = (uVar15 ^ uVar19 ^ uVar18) + uVar7 + 0x6ed9eba1 + uVar14 + uVar17;
  uVar15 = util::rotl_fixed<unsigned_int>(uVar15,0x1e);
  uVar8 = util::rotl_fixed<unsigned_int>(uVar3 ^ uVar22 ^ uVar10 ^ uVar8,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar17,5);
  uVar18 = (uVar16 ^ uVar15 ^ uVar19) + uVar8 + 0x6ed9eba1 + uVar14 + uVar18;
  uVar16 = util::rotl_fixed<unsigned_int>(uVar16,0x1e);
  uVar9 = util::rotl_fixed<unsigned_int>(uVar5 ^ uVar2 ^ uVar11 ^ uVar9,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar18,5);
  uVar19 = (uVar17 ^ uVar16 ^ uVar15) + uVar9 + 0x6ed9eba1 + uVar14 + uVar19;
  uVar17 = util::rotl_fixed<unsigned_int>(uVar17,0x1e);
  uVar10 = util::rotl_fixed<unsigned_int>(uVar7 ^ uVar4 ^ uVar12 ^ uVar10,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar19,5);
  uVar15 = (uVar18 ^ uVar17 ^ uVar16) + uVar10 + 0x6ed9eba1 + uVar14 + uVar15;
  uVar18 = util::rotl_fixed<unsigned_int>(uVar18,0x1e);
  uVar11 = util::rotl_fixed<unsigned_int>(uVar8 ^ uVar6 ^ uVar13 ^ uVar11,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar15,5);
  uVar16 = (uVar19 ^ uVar18 ^ uVar17) + uVar11 + 0x6ed9eba1 + uVar14 + uVar16;
  uVar19 = util::rotl_fixed<unsigned_int>(uVar19,0x1e);
  uVar12 = util::rotl_fixed<unsigned_int>(uVar9 ^ uVar1 ^ uVar20 ^ uVar12,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar16,5);
  uVar17 = (uVar15 ^ uVar19 ^ uVar18) + uVar12 + 0x6ed9eba1 + uVar14 + uVar17;
  uVar15 = util::rotl_fixed<unsigned_int>(uVar15,0x1e);
  uVar13 = util::rotl_fixed<unsigned_int>(uVar10 ^ uVar3 ^ uVar21 ^ uVar13,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar17,5);
  uVar18 = (uVar16 ^ uVar15 ^ uVar19) + uVar13 + 0x6ed9eba1 + uVar14 + uVar18;
  uVar16 = util::rotl_fixed<unsigned_int>(uVar16,0x1e);
  uVar20 = util::rotl_fixed<unsigned_int>(uVar11 ^ uVar5 ^ uVar22 ^ uVar20,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar18,5);
  uVar19 = (uVar17 ^ uVar16 ^ uVar15) + uVar20 + 0x6ed9eba1 + uVar14 + uVar19;
  uVar17 = util::rotl_fixed<unsigned_int>(uVar17,0x1e);
  uVar21 = util::rotl_fixed<unsigned_int>(uVar12 ^ uVar7 ^ uVar2 ^ uVar21,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar19,5);
  uVar15 = (uVar18 ^ uVar17 ^ uVar16) + uVar21 + 0x6ed9eba1 + uVar14 + uVar15;
  uVar18 = util::rotl_fixed<unsigned_int>(uVar18,0x1e);
  uVar22 = util::rotl_fixed<unsigned_int>(uVar13 ^ uVar8 ^ uVar4 ^ uVar22,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar15,5);
  uVar16 = (uVar19 ^ uVar18 ^ uVar17) + uVar22 + 0x6ed9eba1 + uVar14 + uVar16;
  uVar19 = util::rotl_fixed<unsigned_int>(uVar19,0x1e);
  uVar2 = util::rotl_fixed<unsigned_int>(uVar20 ^ uVar9 ^ uVar6 ^ uVar2,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar16,5);
  uVar17 = (uVar15 ^ uVar19 ^ uVar18) + uVar2 + 0x6ed9eba1 + uVar14 + uVar17;
  uVar15 = util::rotl_fixed<unsigned_int>(uVar15,0x1e);
  uVar4 = util::rotl_fixed<unsigned_int>(uVar21 ^ uVar10 ^ uVar1 ^ uVar4,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar17,5);
  uVar18 = (uVar16 ^ uVar15 ^ uVar19) + uVar4 + 0x6ed9eba1 + uVar14 + uVar18;
  uVar16 = util::rotl_fixed<unsigned_int>(uVar16,0x1e);
  uVar6 = util::rotl_fixed<unsigned_int>(uVar22 ^ uVar11 ^ uVar3 ^ uVar6,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar18,5);
  uVar19 = (uVar17 ^ uVar16 ^ uVar15) + uVar6 + 0x6ed9eba1 + uVar14 + uVar19;
  uVar17 = util::rotl_fixed<unsigned_int>(uVar17,0x1e);
  uVar1 = util::rotl_fixed<unsigned_int>(uVar2 ^ uVar12 ^ uVar5 ^ uVar1,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar19,5);
  uVar15 = (uVar18 ^ uVar17 ^ uVar16) + uVar1 + 0x6ed9eba1 + uVar14 + uVar15;
  uVar18 = util::rotl_fixed<unsigned_int>(uVar18,0x1e);
  uVar3 = util::rotl_fixed<unsigned_int>(uVar4 ^ uVar13 ^ uVar7 ^ uVar3,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar15,5);
  uVar16 = (uVar19 ^ uVar18 ^ uVar17) + uVar3 + 0x6ed9eba1 + uVar14 + uVar16;
  uVar19 = util::rotl_fixed<unsigned_int>(uVar19,0x1e);
  uVar5 = util::rotl_fixed<unsigned_int>(uVar6 ^ uVar20 ^ uVar8 ^ uVar5,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar16,5);
  uVar17 = (uVar15 & uVar19 | uVar18 & (uVar15 | uVar19)) + uVar5 + -0x70e44324 + uVar14 + uVar17;
  uVar15 = util::rotl_fixed<unsigned_int>(uVar15,0x1e);
  uVar7 = util::rotl_fixed<unsigned_int>(uVar1 ^ uVar21 ^ uVar9 ^ uVar7,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar17,5);
  uVar18 = (uVar16 & uVar15 | uVar19 & (uVar16 | uVar15)) + uVar7 + -0x70e44324 + uVar14 + uVar18;
  uVar16 = util::rotl_fixed<unsigned_int>(uVar16,0x1e);
  uVar8 = util::rotl_fixed<unsigned_int>(uVar3 ^ uVar22 ^ uVar10 ^ uVar8,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar18,5);
  uVar19 = (uVar17 & uVar16 | uVar15 & (uVar17 | uVar16)) + uVar8 + -0x70e44324 + uVar14 + uVar19;
  uVar17 = util::rotl_fixed<unsigned_int>(uVar17,0x1e);
  uVar9 = util::rotl_fixed<unsigned_int>(uVar5 ^ uVar2 ^ uVar11 ^ uVar9,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar19,5);
  uVar15 = (uVar18 & uVar17 | uVar16 & (uVar18 | uVar17)) + uVar9 + -0x70e44324 + uVar14 + uVar15;
  uVar18 = util::rotl_fixed<unsigned_int>(uVar18,0x1e);
  uVar10 = util::rotl_fixed<unsigned_int>(uVar7 ^ uVar4 ^ uVar12 ^ uVar10,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar15,5);
  uVar16 = (uVar19 & uVar18 | uVar17 & (uVar19 | uVar18)) + uVar10 + -0x70e44324 + uVar14 + uVar16;
  uVar19 = util::rotl_fixed<unsigned_int>(uVar19,0x1e);
  uVar11 = util::rotl_fixed<unsigned_int>(uVar8 ^ uVar6 ^ uVar13 ^ uVar11,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar16,5);
  uVar17 = (uVar15 & uVar19 | uVar18 & (uVar15 | uVar19)) + uVar11 + -0x70e44324 + uVar14 + uVar17;
  uVar15 = util::rotl_fixed<unsigned_int>(uVar15,0x1e);
  uVar12 = util::rotl_fixed<unsigned_int>(uVar9 ^ uVar1 ^ uVar20 ^ uVar12,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar17,5);
  uVar18 = (uVar16 & uVar15 | uVar19 & (uVar16 | uVar15)) + uVar12 + -0x70e44324 + uVar14 + uVar18;
  uVar16 = util::rotl_fixed<unsigned_int>(uVar16,0x1e);
  uVar13 = util::rotl_fixed<unsigned_int>(uVar10 ^ uVar3 ^ uVar21 ^ uVar13,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar18,5);
  uVar19 = (uVar17 & uVar16 | uVar15 & (uVar17 | uVar16)) + uVar13 + -0x70e44324 + uVar14 + uVar19;
  uVar17 = util::rotl_fixed<unsigned_int>(uVar17,0x1e);
  uVar20 = util::rotl_fixed<unsigned_int>(uVar11 ^ uVar5 ^ uVar22 ^ uVar20,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar19,5);
  uVar15 = (uVar18 & uVar17 | uVar16 & (uVar18 | uVar17)) + uVar20 + -0x70e44324 + uVar14 + uVar15;
  uVar18 = util::rotl_fixed<unsigned_int>(uVar18,0x1e);
  uVar21 = util::rotl_fixed<unsigned_int>(uVar12 ^ uVar7 ^ uVar2 ^ uVar21,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar15,5);
  uVar16 = (uVar19 & uVar18 | uVar17 & (uVar19 | uVar18)) + uVar21 + -0x70e44324 + uVar14 + uVar16;
  uVar19 = util::rotl_fixed<unsigned_int>(uVar19,0x1e);
  uVar22 = util::rotl_fixed<unsigned_int>(uVar13 ^ uVar8 ^ uVar4 ^ uVar22,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar16,5);
  uVar17 = (uVar15 & uVar19 | uVar18 & (uVar15 | uVar19)) + uVar22 + -0x70e44324 + uVar14 + uVar17;
  uVar15 = util::rotl_fixed<unsigned_int>(uVar15,0x1e);
  uVar2 = util::rotl_fixed<unsigned_int>(uVar20 ^ uVar9 ^ uVar6 ^ uVar2,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar17,5);
  uVar18 = (uVar16 & uVar15 | uVar19 & (uVar16 | uVar15)) + uVar2 + -0x70e44324 + uVar14 + uVar18;
  uVar16 = util::rotl_fixed<unsigned_int>(uVar16,0x1e);
  uVar4 = util::rotl_fixed<unsigned_int>(uVar21 ^ uVar10 ^ uVar1 ^ uVar4,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar18,5);
  uVar19 = (uVar17 & uVar16 | uVar15 & (uVar17 | uVar16)) + uVar4 + -0x70e44324 + uVar14 + uVar19;
  uVar17 = util::rotl_fixed<unsigned_int>(uVar17,0x1e);
  uVar6 = util::rotl_fixed<unsigned_int>(uVar22 ^ uVar11 ^ uVar3 ^ uVar6,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar19,5);
  uVar15 = (uVar18 & uVar17 | uVar16 & (uVar18 | uVar17)) + uVar6 + -0x70e44324 + uVar14 + uVar15;
  uVar18 = util::rotl_fixed<unsigned_int>(uVar18,0x1e);
  uVar1 = util::rotl_fixed<unsigned_int>(uVar2 ^ uVar12 ^ uVar5 ^ uVar1,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar15,5);
  uVar16 = (uVar19 & uVar18 | uVar17 & (uVar19 | uVar18)) + uVar1 + -0x70e44324 + uVar14 + uVar16;
  uVar19 = util::rotl_fixed<unsigned_int>(uVar19,0x1e);
  uVar3 = util::rotl_fixed<unsigned_int>(uVar4 ^ uVar13 ^ uVar7 ^ uVar3,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar16,5);
  uVar17 = (uVar15 & uVar19 | uVar18 & (uVar15 | uVar19)) + uVar3 + -0x70e44324 + uVar14 + uVar17;
  uVar15 = util::rotl_fixed<unsigned_int>(uVar15,0x1e);
  uVar5 = util::rotl_fixed<unsigned_int>(uVar6 ^ uVar20 ^ uVar8 ^ uVar5,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar17,5);
  uVar18 = (uVar16 & uVar15 | uVar19 & (uVar16 | uVar15)) + uVar5 + -0x70e44324 + uVar14 + uVar18;
  uVar16 = util::rotl_fixed<unsigned_int>(uVar16,0x1e);
  uVar7 = util::rotl_fixed<unsigned_int>(uVar1 ^ uVar21 ^ uVar9 ^ uVar7,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar18,5);
  uVar19 = (uVar17 & uVar16 | uVar15 & (uVar17 | uVar16)) + uVar7 + -0x70e44324 + uVar14 + uVar19;
  uVar17 = util::rotl_fixed<unsigned_int>(uVar17,0x1e);
  uVar8 = util::rotl_fixed<unsigned_int>(uVar3 ^ uVar22 ^ uVar10 ^ uVar8,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar19,5);
  uVar15 = (uVar18 & uVar17 | uVar16 & (uVar18 | uVar17)) + uVar8 + -0x70e44324 + uVar14 + uVar15;
  uVar18 = util::rotl_fixed<unsigned_int>(uVar18,0x1e);
  uVar9 = util::rotl_fixed<unsigned_int>(uVar5 ^ uVar2 ^ uVar11 ^ uVar9,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar15,5);
  uVar16 = (uVar19 & uVar18 | uVar17 & (uVar19 | uVar18)) + uVar9 + -0x70e44324 + uVar14 + uVar16;
  uVar19 = util::rotl_fixed<unsigned_int>(uVar19,0x1e);
  uVar10 = util::rotl_fixed<unsigned_int>(uVar7 ^ uVar4 ^ uVar12 ^ uVar10,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar16,5);
  uVar17 = (uVar15 ^ uVar19 ^ uVar18) + uVar10 + -0x359d3e2a + uVar14 + uVar17;
  uVar15 = util::rotl_fixed<unsigned_int>(uVar15,0x1e);
  uVar11 = util::rotl_fixed<unsigned_int>(uVar8 ^ uVar6 ^ uVar13 ^ uVar11,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar17,5);
  uVar18 = (uVar16 ^ uVar15 ^ uVar19) + uVar11 + -0x359d3e2a + uVar14 + uVar18;
  uVar16 = util::rotl_fixed<unsigned_int>(uVar16,0x1e);
  uVar12 = util::rotl_fixed<unsigned_int>(uVar9 ^ uVar1 ^ uVar20 ^ uVar12,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar18,5);
  uVar19 = (uVar17 ^ uVar16 ^ uVar15) + uVar12 + -0x359d3e2a + uVar14 + uVar19;
  uVar17 = util::rotl_fixed<unsigned_int>(uVar17,0x1e);
  uVar13 = util::rotl_fixed<unsigned_int>(uVar10 ^ uVar3 ^ uVar21 ^ uVar13,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar19,5);
  uVar15 = (uVar18 ^ uVar17 ^ uVar16) + uVar13 + -0x359d3e2a + uVar14 + uVar15;
  uVar18 = util::rotl_fixed<unsigned_int>(uVar18,0x1e);
  uVar20 = util::rotl_fixed<unsigned_int>(uVar11 ^ uVar5 ^ uVar22 ^ uVar20,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar15,5);
  uVar16 = (uVar19 ^ uVar18 ^ uVar17) + uVar20 + -0x359d3e2a + uVar14 + uVar16;
  uVar19 = util::rotl_fixed<unsigned_int>(uVar19,0x1e);
  uVar21 = util::rotl_fixed<unsigned_int>(uVar12 ^ uVar7 ^ uVar2 ^ uVar21,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar16,5);
  uVar17 = (uVar15 ^ uVar19 ^ uVar18) + uVar21 + -0x359d3e2a + uVar14 + uVar17;
  uVar15 = util::rotl_fixed<unsigned_int>(uVar15,0x1e);
  uVar22 = util::rotl_fixed<unsigned_int>(uVar13 ^ uVar8 ^ uVar4 ^ uVar22,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar17,5);
  uVar18 = (uVar16 ^ uVar15 ^ uVar19) + uVar22 + -0x359d3e2a + uVar14 + uVar18;
  uVar16 = util::rotl_fixed<unsigned_int>(uVar16,0x1e);
  uVar2 = util::rotl_fixed<unsigned_int>(uVar20 ^ uVar9 ^ uVar6 ^ uVar2,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar18,5);
  uVar19 = (uVar17 ^ uVar16 ^ uVar15) + uVar2 + -0x359d3e2a + uVar14 + uVar19;
  uVar17 = util::rotl_fixed<unsigned_int>(uVar17,0x1e);
  uVar4 = util::rotl_fixed<unsigned_int>(uVar21 ^ uVar10 ^ uVar1 ^ uVar4,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar19,5);
  uVar15 = (uVar18 ^ uVar17 ^ uVar16) + uVar4 + -0x359d3e2a + uVar14 + uVar15;
  uVar18 = util::rotl_fixed<unsigned_int>(uVar18,0x1e);
  uVar6 = util::rotl_fixed<unsigned_int>(uVar22 ^ uVar11 ^ uVar3 ^ uVar6,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar15,5);
  uVar16 = (uVar19 ^ uVar18 ^ uVar17) + uVar6 + -0x359d3e2a + uVar14 + uVar16;
  uVar19 = util::rotl_fixed<unsigned_int>(uVar19,0x1e);
  uVar1 = util::rotl_fixed<unsigned_int>(uVar2 ^ uVar12 ^ uVar5 ^ uVar1,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar16,5);
  uVar17 = (uVar15 ^ uVar19 ^ uVar18) + uVar1 + -0x359d3e2a + uVar14 + uVar17;
  uVar15 = util::rotl_fixed<unsigned_int>(uVar15,0x1e);
  uVar3 = util::rotl_fixed<unsigned_int>(uVar4 ^ uVar13 ^ uVar7 ^ uVar3,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar17,5);
  uVar18 = (uVar16 ^ uVar15 ^ uVar19) + uVar3 + -0x359d3e2a + uVar14 + uVar18;
  uVar16 = util::rotl_fixed<unsigned_int>(uVar16,0x1e);
  uVar5 = util::rotl_fixed<unsigned_int>(uVar6 ^ uVar20 ^ uVar8 ^ uVar5,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar18,5);
  uVar19 = (uVar17 ^ uVar16 ^ uVar15) + uVar5 + -0x359d3e2a + uVar14 + uVar19;
  uVar17 = util::rotl_fixed<unsigned_int>(uVar17,0x1e);
  uVar7 = util::rotl_fixed<unsigned_int>(uVar1 ^ uVar21 ^ uVar9 ^ uVar7,1);
  uVar14 = util::rotl_fixed<unsigned_int>(uVar19,5);
  uVar15 = (uVar18 ^ uVar17 ^ uVar16) + uVar7 + -0x359d3e2a + uVar14 + uVar15;
  uVar14 = util::rotl_fixed<unsigned_int>(uVar18,0x1e);
  uVar22 = util::rotl_fixed<unsigned_int>(uVar3 ^ uVar22 ^ uVar10 ^ uVar8,1);
  uVar8 = util::rotl_fixed<unsigned_int>(uVar15,5);
  uVar16 = (uVar19 ^ uVar14 ^ uVar17) + uVar22 + -0x359d3e2a + uVar8 + uVar16;
  uVar8 = util::rotl_fixed<unsigned_int>(uVar19,0x1e);
  uVar2 = util::rotl_fixed<unsigned_int>(uVar5 ^ uVar2 ^ uVar11 ^ uVar9,1);
  uVar5 = util::rotl_fixed<unsigned_int>(uVar16,5);
  uVar17 = (uVar15 ^ uVar8 ^ uVar14) + uVar2 + -0x359d3e2a + uVar5 + uVar17;
  uVar9 = util::rotl_fixed<unsigned_int>(uVar15,0x1e);
  uVar4 = util::rotl_fixed<unsigned_int>(uVar7 ^ uVar4 ^ uVar12 ^ uVar10,1);
  uVar5 = util::rotl_fixed<unsigned_int>(uVar17,5);
  uVar14 = (uVar16 ^ uVar9 ^ uVar8) + uVar4 + -0x359d3e2a + uVar5 + uVar14;
  uVar5 = util::rotl_fixed<unsigned_int>(uVar16,0x1e);
  uVar22 = util::rotl_fixed<unsigned_int>(uVar22 ^ uVar6 ^ uVar13 ^ uVar11,1);
  uVar6 = util::rotl_fixed<unsigned_int>(uVar14,5);
  uVar8 = (uVar17 ^ uVar5 ^ uVar9) + uVar22 + -0x359d3e2a + uVar6 + uVar8;
  uVar22 = util::rotl_fixed<unsigned_int>(uVar17,0x1e);
  uVar6 = util::rotl_fixed<unsigned_int>(uVar2 ^ uVar1 ^ uVar20 ^ uVar12,1);
  uVar2 = util::rotl_fixed<unsigned_int>(uVar8,5);
  uVar9 = (uVar14 ^ uVar22 ^ uVar5) + uVar6 + -0x359d3e2a + uVar2 + uVar9;
  uVar6 = util::rotl_fixed<unsigned_int>(uVar14,0x1e);
  uVar21 = util::rotl_fixed<unsigned_int>(uVar4 ^ uVar3 ^ uVar21 ^ uVar13,1);
  uVar4 = util::rotl_fixed<unsigned_int>(uVar9,5);
  uVar2 = util::rotl_fixed<unsigned_int>(uVar8,0x1e);
  *in_RDI = (uVar8 ^ uVar6 ^ uVar22) + uVar21 + -0x359d3e2a + uVar4 + uVar5 + *in_RDI;
  in_RDI[1] = uVar9 + in_RDI[1];
  in_RDI[2] = uVar2 + in_RDI[2];
  in_RDI[3] = uVar6 + in_RDI[3];
  in_RDI[4] = uVar22 + in_RDI[4];
  return;
}

Assistant:

void sha1_transform::transform(hash_word * state, const hash_word * data) {
	
	#define blk0(i) (W[i] = data[i])
	#define blk1(i) (W[i & 15] = util::rotl_fixed(W[(i + 13) & 15] ^ W[(i + 8) & 15] \
	                                              ^ W[(i + 2) & 15] ^ W[i & 15], 1))
	
	#define f1(x, y, z) (z ^ (x & (y ^ z)))
	#define f2(x, y, z) (x ^ y ^ z)
	#define f3(x, y, z) ((x & y) | (z & (x | y)))
	#define f4(x, y, z) (x ^ y ^ z)
	
	/* (R0+R1), R2, R3, R4 are the different operations used in SHA1 */
	#define R0(v, w, x, y, z, i) \
		z += f1(w, x, y) + blk0(i) + 0x5A827999 + util::rotl_fixed(v, 5); \
		w = util::rotl_fixed(w, 30);
	#define R1(v, w, x, y, z, i) \
		z += f1(w, x, y) + blk1(i) + 0x5A827999 + util::rotl_fixed(v, 5); \
		w = util::rotl_fixed(w, 30);
	#define R2(v, w, x, y, z, i) \
		z += f2(w, x, y) + blk1(i) + 0x6ED9EBA1 + util::rotl_fixed(v, 5); \
		w = util::rotl_fixed(w, 30);
	#define R3(v, w, x, y, z, i) \
		z += f3(w, x, y) + blk1(i) + 0x8F1BBCDC + util::rotl_fixed(v, 5); \
		w = util::rotl_fixed(w, 30);
	#define R4(v, w, x, y, z, i) \
		z += f4(w, x, y) + blk1(i) + 0xCA62C1D6 + util::rotl_fixed(v, 5); \
		w = util::rotl_fixed(w, 30);
	
	hash_word W[16];
	
	/* Copy context->state[] to working vars */
	hash_word a = state[0];
	hash_word b = state[1];
	hash_word c = state[2];
	hash_word d = state[3];
	hash_word e = state[4];
	
	/* 4 rounds of 20 operations each. Loop unrolled. */
	
	R0(a, b, c, d, e,  0);
	R0(e, a, b, c, d,  1);
	R0(d, e, a, b, c,  2);
	R0(c, d, e, a, b,  3);
	
	R0(b, c, d, e, a,  4);
	R0(a, b, c, d, e,  5);
	R0(e, a, b, c, d,  6);
	R0(d, e, a, b, c,  7);
	
	R0(c, d, e, a, b,  8);
	R0(b, c, d, e, a,  9);
	R0(a, b, c, d, e, 10);
	R0(e, a, b, c, d, 11);
	
	R0(d, e, a, b, c, 12);
	R0(c, d, e, a, b, 13);
	R0(b, c, d, e, a, 14);
	R0(a, b, c, d, e, 15);
	
	R1(e, a, b, c, d, 16);
	R1(d, e, a, b, c, 17);
	R1(c, d, e, a, b, 18);
	R1(b, c, d, e, a, 19);
	
	R2(a, b, c, d, e, 20);
	R2(e, a, b, c, d, 21);
	R2(d, e, a, b, c, 22);
	R2(c, d, e, a, b, 23);
	
	R2(b, c, d, e, a, 24);
	R2(a, b, c, d, e, 25);
	R2(e, a, b, c, d, 26);
	R2(d, e, a, b, c, 27);
	
	R2(c, d, e, a, b, 28);
	R2(b, c, d, e, a, 29);
	R2(a, b, c, d, e, 30);
	R2(e, a, b, c, d, 31);
	
	R2(d, e, a, b, c, 32);
	R2(c, d, e, a, b, 33);
	R2(b, c, d, e, a, 34);
	R2(a, b, c, d, e, 35);
	
	R2(e, a, b, c, d, 36);
	R2(d, e, a, b, c, 37);
	R2(c, d, e, a, b, 38);
	R2(b, c, d, e, a, 39);
	
	R3(a, b, c, d, e, 40);
	R3(e, a, b, c, d, 41);
	R3(d, e, a, b, c, 42);
	R3(c, d, e, a, b, 43);
	
	R3(b, c, d, e, a, 44);
	R3(a, b, c, d, e, 45);
	R3(e, a, b, c, d, 46);
	R3(d, e, a, b, c, 47);
	
	R3(c, d, e, a, b, 48);
	R3(b, c, d, e, a, 49);
	R3(a, b, c, d, e, 50);
	R3(e, a, b, c, d, 51);
	
	R3(d, e, a, b, c, 52);
	R3(c, d, e, a, b, 53);
	R3(b, c, d, e, a, 54);
	R3(a, b, c, d, e, 55);
	
	R3(e, a, b, c, d, 56);
	R3(d, e, a, b, c, 57);
	R3(c, d, e, a, b, 58);
	R3(b, c, d, e, a, 59);
	
	R4(a, b, c, d, e, 60);
	R4(e, a, b, c, d, 61);
	R4(d, e, a, b, c, 62);
	R4(c, d, e, a, b, 63);
	
	R4(b, c, d, e, a, 64);
	R4(a, b, c, d, e, 65);
	R4(e, a, b, c, d, 66);
	R4(d, e, a, b, c, 67);
	
	R4(c, d, e, a, b, 68);
	R4(b, c, d, e, a, 69);
	R4(a, b, c, d, e, 70);
	R4(e, a, b, c, d, 71);
	
	R4(d, e, a, b, c, 72);
	R4(c, d, e, a, b, 73);
	R4(b, c, d, e, a, 74);
	R4(a, b, c, d, e, 75);
	
	R4(e, a, b, c, d, 76);
	R4(d, e, a, b, c, 77);
	R4(c, d, e, a, b, 78);
	R4(b, c, d, e, a, 79);
	
	/* Add the working vars back into context.state[] */
	state[0] += a;
	state[1] += b;
	state[2] += c;
	state[3] += d;
	state[4] += e;
	
	#undef R4
	#undef R3
	#undef R2
	#undef R1
	#undef R0
	
	#undef f4
	#undef f3
	#undef f2
	#undef f1
	
	#undef blk1
	#undef blk0
	
}